

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

size_t __thiscall std::hash<units::unit>::operator()(hash<units::unit> *this,unit *x)

{
  unit_data uVar1;
  uint32_t bits;
  size_t sVar2;
  hash<float> local_9;
  
  uVar1 = x->base_units_;
  sVar2 = hash<float>::operator()(&local_9,(float)((int)x->multiplier_ + 8U & 0xfffffff0));
  return sVar2 ^ (uint)uVar1;
}

Assistant:

constexpr detail::unit_data base_units() const { return base_units_; }